

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_dec_refpass_mqc_vsc(opj_t1_t *t1,int bpno)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  int *unaff_retaddr;
  flag_t *in_stack_00000008;
  int vsc;
  int neghalf;
  int poshalf;
  int one;
  int k;
  int j;
  int i;
  int local_18;
  int local_14;
  int local_10;
  
  for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x2c); local_18 = local_18 + 4) {
    for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x28); local_10 = local_10 + 1) {
      local_14 = local_18;
      while( true ) {
        bVar1 = false;
        if (local_14 < local_18 + 4) {
          bVar1 = local_14 < *(int *)(in_RDI + 0x2c);
        }
        if (!bVar1) break;
        t1_dec_refpass_step_mqc_vsc
                  (_vsc,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                   in_ESI);
        local_14 = local_14 + 1;
      }
    }
  }
  return;
}

Assistant:

static void t1_dec_refpass_mqc_vsc(
		opj_t1_t *t1,
		int bpno)
{
	int i, j, k, one, poshalf, neghalf;
	int vsc;
	one = 1 << bpno;
	poshalf = one >> 1;
	neghalf = bpno > 0 ? -poshalf : -1;
	for (k = 0; k < t1->h; k += 4) {
		for (i = 0; i < t1->w; ++i) {
			for (j = k; j < k + 4 && j < t1->h; ++j) {
				vsc = ((j == k + 3 || j == t1->h - 1)) ? 1 : 0;
				t1_dec_refpass_step_mqc_vsc(
						t1,
						&t1->flags[((j+1) * t1->flags_stride) + i + 1],
						&t1->data[(j * t1->w) + i],
						poshalf,
						neghalf,
						vsc);
			}
		}
	}
}